

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O1

void __thiscall diligent_spirv_cross::Compiler::build_combined_image_samplers(Compiler *this)

{
  uint uVar1;
  size_t sVar2;
  TypedID<(diligent_spirv_cross::Types)0> *pTVar3;
  Variant *pVVar4;
  SPIRFunction *pSVar5;
  long lVar6;
  CombinedImageSamplerHandler handler;
  CombinedImageSamplerHandler local_d8;
  
  ParsedIR::create_loop_hard_lock(&this->ir);
  sVar2 = (this->ir).ids_for_type[4].
          super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.
          buffer_size;
  if (sVar2 != 0) {
    pTVar3 = (this->ir).ids_for_type[4].
             super_VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>.ptr;
    lVar6 = 0;
    do {
      uVar1 = *(uint *)((long)&pTVar3->id + lVar6);
      pVVar4 = (this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr;
      if (pVVar4[uVar1].type == TypeFunction) {
        pSVar5 = Variant::get<diligent_spirv_cross::SPIRFunction>(pVVar4 + uVar1);
        (pSVar5->combined_parameters).
        super_VectorView<diligent_spirv_cross::SPIRFunction::CombinedImageSamplerParameter>.
        buffer_size = 0;
        (pSVar5->shadow_arguments).super_VectorView<diligent_spirv_cross::SPIRFunction::Parameter>.
        buffer_size = 0;
        pSVar5->do_combined_parameters = true;
      }
      lVar6 = lVar6 + 4;
    } while (sVar2 << 2 != lVar6);
  }
  ParsedIR::LoopLock::~LoopLock((LoopLock *)&local_d8);
  (this->combined_image_samplers).super_VectorView<diligent_spirv_cross::CombinedImageSampler>.
  buffer_size = 0;
  CombinedImageSamplerHandler::CombinedImageSamplerHandler(&local_d8,this);
  pSVar5 = Variant::get<diligent_spirv_cross::SPIRFunction>
                     ((this->ir).ids.super_VectorView<diligent_spirv_cross::Variant>.ptr +
                      (this->ir).default_entry_point.id);
  traverse_all_reachable_opcodes(this,pSVar5,&local_d8.super_OpcodeHandler);
  local_d8.super_OpcodeHandler._vptr_OpcodeHandler =
       (_func_int **)&PTR__CombinedImageSamplerHandler_0093a208;
  ::std::
  _Deque_base<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
  ::~_Deque_base((_Deque_base<diligent_spirv_cross::SPIRFunction_*,_std::allocator<diligent_spirv_cross::SPIRFunction_*>_>
                  *)&local_d8.functions);
  ::std::
  deque<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>,_std::allocator<std::unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>_>_>
  ::~deque(&local_d8.parameter_remapping.c);
  return;
}

Assistant:

void Compiler::build_combined_image_samplers()
{
	ir.for_each_typed_id<SPIRFunction>([&](uint32_t, SPIRFunction &func) {
		func.combined_parameters.clear();
		func.shadow_arguments.clear();
		func.do_combined_parameters = true;
	});

	combined_image_samplers.clear();
	CombinedImageSamplerHandler handler(*this);
	traverse_all_reachable_opcodes(get<SPIRFunction>(ir.default_entry_point), handler);
}